

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O2

Token * __thiscall
wabt::WastLexer::GetHexNumberToken
          (Token *__return_storage_ptr__,WastLexer *this,TokenType token_type)

{
  char *pcVar1;
  bool bVar2;
  byte *pbVar3;
  LiteralType literal_type;
  uint c;
  
  bVar2 = ReadHexNum(this);
  if (bVar2) {
    pbVar3 = (byte *)this->cursor_;
    if ((pbVar3 < this->buffer_end_) && (*pbVar3 == 0x2e)) {
      pbVar3 = pbVar3 + 1;
      this->cursor_ = (char *)pbVar3;
      if (pbVar3 < this->buffer_end_) {
        c = (uint)*pbVar3;
      }
      else {
        c = 0xffffffff;
      }
      bVar2 = IsHexDigit(c);
      token_type = First_Literal;
      if ((bVar2) && (bVar2 = ReadHexNum(this), !bVar2)) goto LAB_00129bd1;
    }
    pcVar1 = this->cursor_;
    if ((pcVar1 < this->buffer_end_) && ((*pcVar1 == 'p' || (*pcVar1 == 'P')))) {
      this->cursor_ = pcVar1 + 1;
      ReadSign(this);
      bVar2 = ReadNum(this);
      if (!bVar2) goto LAB_00129bd1;
      token_type = First_Literal;
    }
    bVar2 = NoTrailingReservedChars(this);
    if (bVar2) {
      if (token_type == First_Literal) {
        token_type = First_Literal;
        literal_type = Hexfloat;
      }
      else {
        literal_type = Int;
      }
      LiteralToken(__return_storage_ptr__,this,token_type,literal_type);
      return __return_storage_ptr__;
    }
  }
LAB_00129bd1:
  GetReservedToken(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::GetHexNumberToken(TokenType token_type) {
  if (ReadHexNum()) {
    if (MatchChar('.')) {
      token_type = TokenType::Float;
      if (IsHexDigit(PeekChar()) && !ReadHexNum()) {
        return GetReservedToken();
      }
    }
    if (MatchChar('p') || MatchChar('P')) {
      token_type = TokenType::Float;
      ReadSign();
      if (!ReadNum()) {
        return GetReservedToken();
      }
    }
    if (NoTrailingReservedChars()) {
      if (token_type == TokenType::Float) {
        return LiteralToken(token_type, LiteralType::Hexfloat);
      } else {
        return LiteralToken(token_type, LiteralType::Int);
      }
    }
  }
  return GetReservedToken();
}